

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.c
# Opt level: O3

void mbedtls_ct_memcpy_if
               (mbedtls_ct_condition_t condition,uchar *dest,uchar *src1,uchar *src2,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (src2 == (uchar *)0x0) {
    src2 = dest;
  }
  if (len < 8) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    do {
      *(ulong *)(dest + uVar2) =
           *(ulong *)(src2 + uVar2) & ~condition | *(ulong *)(src1 + uVar2) & condition;
      uVar1 = uVar2 + 8;
      uVar3 = uVar2 + 0x10;
      uVar2 = uVar1;
    } while (uVar3 <= len);
  }
  if (uVar1 < len) {
    do {
      dest[uVar1] = src2[uVar1] & (byte)~condition | src1[uVar1] & (byte)condition;
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  return;
}

Assistant:

void mbedtls_ct_memcpy_if(mbedtls_ct_condition_t condition,
                          unsigned char *dest,
                          const unsigned char *src1,
                          const unsigned char *src2,
                          size_t len)
{
#if defined(MBEDTLS_CT_SIZE_64)
    const uint64_t mask     = (uint64_t) condition;
    const uint64_t not_mask = (uint64_t) ~mbedtls_ct_compiler_opaque(condition);
#else
    const uint32_t mask     = (uint32_t) condition;
    const uint32_t not_mask = (uint32_t) ~mbedtls_ct_compiler_opaque(condition);
#endif

    /* If src2 is NULL, setup src2 so that we read from the destination address.
     *
     * This means that if src2 == NULL && condition is false, the result will be a
     * no-op because we read from dest and write the same data back into dest.
     */
    if (src2 == NULL) {
        src2 = dest;
    }

    /* dest[i] = c1 == c2 ? src[i] : dest[i] */
    size_t i = 0;
#if defined(MBEDTLS_EFFICIENT_UNALIGNED_ACCESS)
#if defined(MBEDTLS_CT_SIZE_64)
    for (; (i + 8) <= len; i += 8) {
        uint64_t a = mbedtls_get_unaligned_uint64(src1 + i) & mask;
        uint64_t b = mbedtls_get_unaligned_uint64(src2 + i) & not_mask;
        mbedtls_put_unaligned_uint64(dest + i, a | b);
    }
#else
    for (; (i + 4) <= len; i += 4) {
        uint32_t a = mbedtls_get_unaligned_uint32(src1 + i) & mask;
        uint32_t b = mbedtls_get_unaligned_uint32(src2 + i) & not_mask;
        mbedtls_put_unaligned_uint32(dest + i, a | b);
    }
#endif /* defined(MBEDTLS_CT_SIZE_64) */
#endif /* MBEDTLS_EFFICIENT_UNALIGNED_ACCESS */
    for (; i < len; i++) {
        dest[i] = (src1[i] & mask) | (src2[i] & not_mask);
    }
}